

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O3

Relations __thiscall dg::vr::ValueRelations::_between(ValueRelations *this,V lt,size_t rt)

{
  pointer ppVar1;
  Handle lt_00;
  _Base_bitset<1UL> *p_Var2;
  pointer ppVar3;
  
  ppVar3 = (this->graph).borderBuckets.
           super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->graph).borderBuckets.
           super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 == ppVar1) {
    return (Relations)0;
  }
  do {
    if (ppVar3->first == rt) {
      lt_00 = (ppVar3->second)._M_data;
      if (lt_00 == (Handle)0x0) {
        return (Relations)0;
      }
      _between(this,lt_00,lt);
      p_Var2 = (_Base_bitset<1UL> *)dg::vr::Relations::invert();
      return (Relations)p_Var2->_M_w;
    }
    ppVar3 = ppVar3 + 1;
  } while (ppVar3 != ppVar1);
  return (Relations)0;
}

Assistant:

Relations ValueRelations::_between(V lt, size_t rt) const {
    HandlePtr mH = getBorderH(rt);
    return mH ? _between(lt, *mH) : Relations();
}